

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

bool __thiscall
httplib::Server::read_content_core
          (Server *this,Stream *strm,Request *req,Response *res,ContentReceiver *receiver,
          MultipartContentHeader *mulitpart_header,ContentReceiver *multipart_receiver)

{
  size_t payload_max_length;
  bool bVar1;
  bool bVar2;
  ContentReceiverWithProgress out;
  string boundary;
  MultipartFormDataParser multipart_form_data_parser;
  string local_1c8;
  _Any_data local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  _Any_data local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  string local_160;
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_140;
  anon_class_24_3_23d8765b local_120;
  MultipartFormDataParser local_108;
  
  detail::MultipartFormDataParser::MultipartFormDataParser(&local_108);
  local_198 = 0;
  uStack_190 = 0;
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  bVar1 = Request::is_multipart_form_data(req);
  if (bVar1) {
    Request::get_header_value_abi_cxx11_(&local_1c8,req,"Content-Type",0);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    local_160._M_string_length = 0;
    local_160.field_2._M_local_buf[0] = '\0';
    bVar1 = detail::parse_multipart_boundary(&local_1c8,&local_160);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&local_108);
      local_120.multipart_receiver = multipart_receiver;
      local_120.multipart_form_data_parser = &local_108;
      local_120.mulitpart_header = mulitpart_header;
      std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
                 local_1a8._M_pod_data,&local_120);
    }
    else {
      res->status = 400;
    }
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (bVar1) goto LAB_0011f8e2;
  }
  else {
    std::function<bool_(const_char_*,_unsigned_long)>::function
              ((function<bool_(const_char_*,_unsigned_long)> *)&local_1c8,receiver);
    std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
              ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
               local_1a8._M_pod_data,(anon_class_32_1_b7b80f6d *)&local_1c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
LAB_0011f8e2:
    bVar1 = std::operator==(&req->method,"DELETE");
    if (bVar1) {
      bVar1 = detail::has_header(&req->headers,"Content-Length");
      bVar2 = true;
      if (!bVar1) goto LAB_0011f99e;
    }
    payload_max_length = this->payload_max_length_;
    local_178 = 0;
    uStack_170 = 0;
    local_188._M_unused._M_object = (void *)0x0;
    local_188._8_8_ = 0;
    std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
              (&local_140,
               (function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
               &local_1a8);
    bVar1 = detail::read_content<httplib::Request>
                      (strm,req,payload_max_length,&res->status,(Progress *)&local_188,&local_140,
                       true);
    std::_Function_base::~_Function_base(&local_140.super__Function_base);
    std::_Function_base::~_Function_base((_Function_base *)&local_188);
    if (bVar1) {
      bVar1 = Request::is_multipart_form_data(req);
      bVar2 = true;
      if ((!bVar1) || (local_108.is_valid_ != false)) goto LAB_0011f99e;
      res->status = 400;
    }
  }
  bVar2 = false;
LAB_0011f99e:
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  detail::MultipartFormDataParser::~MultipartFormDataParser(&local_108);
  return bVar2;
}

Assistant:

inline bool Server::read_content_core(Stream& strm, Request& req, Response& res,
        ContentReceiver receiver,
        MultipartContentHeader mulitpart_header,
        ContentReceiver multipart_receiver) {
        detail::MultipartFormDataParser multipart_form_data_parser;
        ContentReceiverWithProgress out;

        if (req.is_multipart_form_data()) {
            const auto& content_type = req.get_header_value("Content-Type");
            std::string boundary;
            if (!detail::parse_multipart_boundary(content_type, boundary)) {
                res.status = 400;
                return false;
            }

            multipart_form_data_parser.set_boundary(std::move(boundary));
            out = [&](const char* buf, size_t n, uint64_t /*off*/, uint64_t /*len*/) {
                /* For debug
                size_t pos = 0;
                while (pos < n) {
                  auto read_size = std::min<size_t>(1, n - pos);
                  auto ret = multipart_form_data_parser.parse(
                      buf + pos, read_size, multipart_receiver, mulitpart_header);
                  if (!ret) { return false; }
                  pos += read_size;
                }
                return true;
                */
                return multipart_form_data_parser.parse(buf, n, multipart_receiver,
                    mulitpart_header);
            };
        }
        else {
            out = [receiver](const char* buf, size_t n, uint64_t /*off*/,
                uint64_t /*len*/) { return receiver(buf, n); };
        }

        if (req.method == "DELETE" && !req.has_header("Content-Length")) {
            return true;
        }

        if (!detail::read_content(strm, req, payload_max_length_, res.status, nullptr,
            out, true)) {
            return false;
        }

        if (req.is_multipart_form_data()) {
            if (!multipart_form_data_parser.is_valid()) {
                res.status = 400;
                return false;
            }
        }

        return true;
    }